

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedBox.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChRoundedBox::GetBoundingBox
          (ChRoundedBox *this,ChVector<double> *cmin,ChVector<double> *cmax,ChMatrix33<double> *rot)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pCVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  initializer_list<chrono::ChVector<double>_> __l;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> vertices;
  allocator_type local_101;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_100;
  ChVector<double> local_e8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_a0;
  double dStack_98;
  double local_90;
  double local_88;
  double dStack_80;
  undefined8 local_78;
  double local_70;
  double dStack_68;
  undefined8 local_60;
  double local_58;
  double dStack_50;
  undefined8 local_48;
  double local_40;
  double dStack_38;
  undefined8 local_30;
  
  local_e8.m_data[2] = (this->Size).m_data[2];
  local_e8.m_data[0] = (this->Size).m_data[0];
  local_e8.m_data[1] = (this->Size).m_data[1];
  local_d0 = -local_e8.m_data[0];
  dStack_b0 = -local_e8.m_data[1];
  auVar5._0_8_ = -local_e8.m_data[2];
  auVar5._8_8_ = 0x8000000000000000;
  local_78 = vmovlpd_avx(auVar5);
  local_60 = vmovlpd_avx(auVar5);
  local_48 = vmovlpd_avx(auVar5);
  local_30 = vmovlpd_avx(auVar5);
  __l._M_len = 8;
  __l._M_array = &local_e8;
  dStack_c8 = local_e8.m_data[1];
  local_c0 = local_e8.m_data[2];
  local_b8 = local_d0;
  local_a8 = local_e8.m_data[2];
  local_a0 = local_e8.m_data[0];
  dStack_98 = dStack_b0;
  local_90 = local_e8.m_data[2];
  local_88 = local_e8.m_data[0];
  dStack_80 = local_e8.m_data[1];
  local_70 = local_d0;
  dStack_68 = local_e8.m_data[1];
  local_58 = local_d0;
  dStack_50 = dStack_b0;
  local_40 = local_e8.m_data[0];
  dStack_38 = dStack_b0;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&local_100,__l,&local_101);
  cmin->m_data[0] = 1.79769313486232e+308;
  cmin->m_data[1] = 1.79769313486232e+308;
  cmin->m_data[2] = 1.79769313486232e+308;
  cmax->m_data[0] = -1.79769313486232e+308;
  cmax->m_data[1] = -1.79769313486232e+308;
  cmax->m_data[2] = -1.79769313486232e+308;
  pCVar4 = local_100.
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while (pCVar4 != local_100.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
    dVar1 = pCVar4->m_data[1];
    auVar9._8_8_ = pCVar4->m_data[0];
    auVar9._0_8_ = pCVar4->m_data[0];
    auVar11._8_8_ = pCVar4->m_data[2];
    auVar11._0_8_ = pCVar4->m_data[2];
    pCVar4 = pCVar4 + 1;
    auVar6._0_8_ = dVar1 * (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[3];
    auVar6._8_8_ = dVar1 * (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[4];
    auVar5 = vfmadd231pd_fma(auVar6,auVar9,
                             *(undefined1 (*) [16])
                              (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1 * (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[5];
    auVar6 = vfmadd231sd_fma(auVar8,auVar9,auVar2);
    auVar2 = vfmadd231pd_fma(auVar5,auVar11,
                             *(undefined1 (*) [16])
                              ((rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 6));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar3 = vfmadd231sd_fma(auVar6,auVar11,auVar3);
    auVar5 = vminpd_avx(*(undefined1 (*) [16])cmin->m_data,auVar2);
    *(undefined1 (*) [16])cmin->m_data = auVar5;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = cmin->m_data[2];
    auVar5 = vminsd_avx(auVar10,auVar3);
    cmin->m_data[2] = auVar5._0_8_;
    auVar5 = vmaxpd_avx(*(undefined1 (*) [16])cmax->m_data,auVar2);
    *(undefined1 (*) [16])cmax->m_data = auVar5;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = cmax->m_data[2];
    auVar5 = vmaxsd_avx(auVar7,auVar3);
    cmax->m_data[2] = auVar5._0_8_;
  }
  if (local_100.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChRoundedBox::GetBoundingBox(ChVector<>& cmin, ChVector<>& cmax, const ChMatrix33<>& rot) const {
    std::vector<ChVector<>> vertices{GetP1(), GetP2(), GetP3(), GetP4(), GetP5(), GetP6(), GetP7(), GetP8()};

    cmin = ChVector<>(+std::numeric_limits<double>::max());
    cmax = ChVector<>(-std::numeric_limits<double>::max());

    for (const auto& v : vertices) {
        auto p = rot.transpose() * v;

        cmin.x() = ChMin(cmin.x(), p.x());
        cmin.y() = ChMin(cmin.y(), p.y());
        cmin.z() = ChMin(cmin.z(), p.z());

        cmax.x() = ChMax(cmax.x(), p.x());
        cmax.y() = ChMax(cmax.y(), p.y());
        cmax.z() = ChMax(cmax.z(), p.z());
    }
}